

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave.c
# Opt level: O3

wchar_t scatter_ext(chunk_conflict *c,loc *places,wchar_t n,loc grid,wchar_t d,_Bool need_los,
                   _func__Bool_chunk_ptr_loc *pred)

{
  long lVar1;
  wchar_t wVar2;
  _Bool _Var3;
  int iVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  uint32_t uVar8;
  void *p;
  uint uVar9;
  loc grid_00;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  wchar_t wVar13;
  ulong uVar14;
  bool bVar15;
  
  wVar6 = L'\0';
  wVar5 = L'\0';
  if (L'\0' < d) {
    wVar5 = d;
  }
  iVar10 = wVar5 * 2 + 1;
  iVar4 = c->width;
  if (iVar10 <= c->width) {
    iVar4 = iVar10;
  }
  if (c->height < iVar10) {
    iVar10 = c->height;
  }
  p = mem_alloc((long)iVar10 * (long)iVar4 * 8);
  wVar5 = grid.y - d;
  wVar13 = grid.y + d;
  if (wVar5 <= wVar13) {
    wVar6 = grid.x - d;
    uVar11 = 0;
    do {
      iVar10 = d * 2 + 1;
      wVar2 = wVar6;
      if (wVar6 <= grid.x + d) {
        do {
          grid_00.y = wVar5;
          grid_00.x = wVar2;
          _Var3 = square_in_bounds_fully(c,grid_00);
          if ((((_Var3) &&
               ((d < L'\x02' ||
                (wVar7 = distance((loc_conflict)grid,(loc_conflict)grid_00), wVar7 <= d)))) &&
              ((!need_los || (_Var3 = los(c,(loc_conflict)grid,(loc_conflict)grid_00), _Var3)))) &&
             ((pred == (_func__Bool_chunk_ptr_loc *)0x0 || (_Var3 = (*pred)(c,grid_00), _Var3)))) {
            *(wchar_t *)((long)p + (long)(int)uVar11 * 8) = wVar2;
            *(wchar_t *)((long)p + (long)(int)uVar11 * 8 + 4) = wVar5;
            uVar11 = uVar11 + 1;
          }
          iVar10 = iVar10 + -1;
          wVar2 = wVar2 + L'\x01';
        } while (iVar10 != 0);
      }
      bVar15 = wVar5 != wVar13;
      wVar5 = wVar5 + L'\x01';
    } while (bVar15);
    wVar6 = L'\0';
    if (0 < (int)uVar11 && L'\0' < n) {
      uVar14 = (ulong)uVar11;
      uVar9 = n + L'\xffffffff';
      if (uVar11 - 1 < (uint)(n + L'\xffffffff')) {
        uVar9 = uVar11 - 1;
      }
      wVar6 = uVar9 + L'\x01';
      uVar12 = 0;
      do {
        uVar8 = Rand_div((uint32_t)uVar14);
        places[uVar12] = *(loc *)((long)p + (long)(int)uVar8 * 8);
        uVar12 = uVar12 + 1;
        lVar1 = uVar14 * 8;
        uVar14 = uVar14 - 1;
        *(undefined8 *)((long)p + (long)(int)uVar8 * 8) = *(undefined8 *)((long)p + lVar1 + -8);
      } while ((uint)wVar6 != uVar12);
    }
  }
  mem_free(p);
  return wVar6;
}

Assistant:

int scatter_ext(struct chunk *c, struct loc *places, int n, struct loc grid,
		int d, bool need_los, bool (*pred)(struct chunk *, struct loc))
{
	int result = 0;
	/* Stores feasible locations. */
	struct loc *feas = mem_alloc(MIN(c->width, (1 + 2 * MAX(0, d)))
			* (size_t) MIN(c->height, (1 + 2 * MAX(0, d)))
			* sizeof(*feas));
	int nfeas = 0;
	struct loc g;

	/* Get the feasible locations. */
	for (g.y = grid.y - d; g.y <= grid.y + d; ++g.y) {
		for (g.x = grid.x - d; g.x <= grid.x + d; ++g.x) {
			if (!square_in_bounds_fully(c, g)) continue;
			if (d > 1 && distance(grid, g) > d) continue;
			if (need_los && !los(c, grid, g)) continue;
			if (pred && !(*pred)(c, g)) continue;
			feas[nfeas] = g;
			++nfeas;
		}
	}

	/* Assemble the result. */
	while (result < n && nfeas > 0) {
		/* Choose one at random and append it to the outgoing list. */
		int choice = randint0(nfeas);

		places[result] = feas[choice];
		++result;
		/* Shift the last feasible one to replace the one selected. */
		--nfeas;
		feas[choice] = feas[nfeas];
	}

	mem_free(feas);
	return result;
}